

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_chown(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  void *pvVar5;
  uv_loop_t *puVar6;
  char *pcVar7;
  char *pcVar8;
  uv_loop_t *puVar9;
  char *pcVar10;
  undefined1 *unaff_R14;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  uv_buf_t uVar15;
  uv_fs_t req;
  undefined1 auStack_588 [88];
  long lStack_530;
  long lStack_528;
  code *pcStack_3d0;
  code *pcStack_3c8;
  undefined8 uStack_3c0;
  char acStack_3b0 [88];
  char *pcStack_358;
  uv_loop_t *puStack_1f8;
  code *pcStack_1f0;
  code *pcStack_1e8;
  code *pcStack_1e0;
  uv_loop_t *puStack_1d8;
  code *pcStack_1d0;
  undefined1 auStack_1c8 [88];
  uv_loop_t *local_170;
  
  puVar11 = auStack_1c8;
  puVar12 = auStack_1c8;
  puVar13 = auStack_1c8;
  puVar14 = auStack_1c8;
  puVar6 = (uv_loop_t *)0x184395;
  pcStack_1d0 = (code *)0x15551c;
  unlink("test_file");
  pcStack_1d0 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_1d0 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar3 = (uv_loop_t *)0x0;
  pcStack_1d0 = (code *)0x15554f;
  iVar1 = uv_fs_open(0,auStack_1c8,"test_file",0x42,0x180,0);
  puVar9 = local_170;
  if (iVar1 < 0) {
    pcStack_1d0 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_1d0 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_1d0 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    puVar11 = unaff_R14;
    pcStack_1d0 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_1d0 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    puVar12 = puVar11;
    pcStack_1d0 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_1d0 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_1d0 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_1d0 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_1d0 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_1d0 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_1d0 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_1d0 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    puVar13 = puVar12;
    pcStack_1d0 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_1d0 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    puVar14 = puVar13;
    pcStack_1d0 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_1d0 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_1d0 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_1d0 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_1d0 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar6 = local_170;
    if ((long)local_170 < 0) goto LAB_00155820;
    pcStack_1d0 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x15558f;
    iVar1 = uv_fs_chown(0,auStack_1c8,"test_file",0xffffffff,0xffffffff,0);
    puVar6 = puVar9;
    unaff_R14 = auStack_1c8;
    if (iVar1 != 0) goto LAB_00155825;
    unaff_R14 = auStack_1c8;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_1d0 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x1555c8;
    iVar1 = uv_fs_fchown(0,auStack_1c8,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015582f;
    puVar11 = auStack_1c8;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_1d0 = (code *)0x1555e7;
    uv_fs_req_cleanup(auStack_1c8);
    pcStack_1d0 = (code *)0x15560f;
    puVar3 = loop;
    iVar1 = uv_fs_chown(loop,auStack_1c8,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155839;
    pcStack_1d0 = (code *)0x155625;
    puVar3 = loop;
    uv_run(loop,0);
    puVar12 = auStack_1c8;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_1d0 = (code *)0x15565e;
    puVar3 = loop;
    iVar1 = uv_fs_chown(loop,auStack_1c8,"test_file",0,0,chown_root_cb);
    puVar12 = auStack_1c8;
    if (iVar1 != 0) goto LAB_00155843;
    pcStack_1d0 = (code *)0x155674;
    puVar3 = loop;
    uv_run(loop,0);
    puVar12 = auStack_1c8;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_1d0 = (code *)0x1556a4;
    puVar3 = loop;
    iVar1 = uv_fs_fchown(loop,auStack_1c8,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,fchown_cb
                        );
    puVar12 = auStack_1c8;
    if (iVar1 != 0) goto LAB_0015584d;
    pcStack_1d0 = (code *)0x1556ba;
    puVar3 = loop;
    uv_run(loop,0);
    puVar12 = auStack_1c8;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x1556e2;
    iVar1 = uv_fs_link(0,auStack_1c8,"test_file","test_file_link",0);
    puVar12 = auStack_1c8;
    if (iVar1 != 0) goto LAB_00155857;
    puVar12 = auStack_1c8;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_1d0 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x155720;
    iVar1 = uv_fs_lchown(0,auStack_1c8,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_00155861;
    puVar13 = auStack_1c8;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_1d0 = (code *)0x15573f;
    uv_fs_req_cleanup(auStack_1c8);
    pcStack_1d0 = (code *)0x155767;
    puVar3 = loop;
    iVar1 = uv_fs_lchown(loop,auStack_1c8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_0015586b;
    pcStack_1d0 = (code *)0x15577d;
    puVar3 = loop;
    uv_run(loop,0);
    puVar14 = auStack_1c8;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x155798;
    iVar1 = uv_fs_close(0,auStack_1c8,(ulong)puVar9 & 0xffffffff,0);
    puVar14 = auStack_1c8;
    if (iVar1 != 0) goto LAB_00155875;
    puVar14 = auStack_1c8;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_1d0 = (code *)0x1557b4;
    uv_fs_req_cleanup(auStack_1c8);
    pcStack_1d0 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_1d0 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_1d0 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_1d0 = (code *)0x1557df;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_1d0 = (code *)0x1557f3;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_1d0 = (code *)0x1557fd;
    uv_run(puVar6,0);
    pcStack_1d0 = (code *)0x155802;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_1d0 = (code *)0x15580a;
    iVar1 = uv_loop_close();
    puVar14 = auStack_1c8;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_1d0 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar3->backend_fd == 0x1a) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_1d8 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_1d8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_1d8 = puVar6;
  if (puVar3->backend_fd == 0x1a) {
    pcStack_1e0 = (code *)0x1558b7;
    puVar9 = puVar3;
    _Var2 = geteuid();
    pvVar5 = puVar3->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar5 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_1e0 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar6 = puVar3;
    if (pvVar5 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar3);
      return iVar1;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar9 = puVar3;
  }
  pcStack_1e0 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar9->backend_fd == 0x1b) {
    if (puVar9->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_1e8 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_1e8 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar9->backend_fd == 0x1e) {
    if (puVar9->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_1f0 = (code *)0x15592b;
    lchown_cb_cold_1();
  }
  pcStack_1f0 = run_test_fs_link;
  lchown_cb_cold_2();
  pcVar7 = "test_file";
  pcStack_3c8 = (code *)0x155949;
  puStack_1f8 = puVar6;
  pcStack_1f0 = (code *)puVar14;
  unlink("test_file");
  pcStack_3c8 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_3c8 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_3c8 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar10 = (char *)0x0;
  pcStack_3c8 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_3b0,"test_file",0x42,0x180,0);
  pcVar8 = pcStack_358;
  if (iVar1 < 0) {
    pcStack_3c8 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_3c8 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_3c8 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_3c8 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_3c8 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_3c8 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar8 = pcVar7;
    pcStack_3c8 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_3c8 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_3c8 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_3c8 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_3c8 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_3c8 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_3c8 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar7 = pcVar8;
    pcStack_3c8 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_3c8 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_3c8 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_3c8 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_3c8 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar7 = pcStack_358;
    if ((long)pcStack_358 < 0) goto LAB_00155cc8;
    pcStack_3c8 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_3b0);
    pcStack_3c8 = (code *)0x1559be;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3c0 = 0;
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x1559f4;
    iVar1 = uv_fs_write(0,acStack_3b0,(ulong)pcVar8 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar8;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_358 != (char *)0xd) goto LAB_00155cd2;
    pcStack_3c8 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_3b0);
    pcStack_3c8 = (code *)0x155a29;
    uv_fs_close(loop,acStack_3b0,(ulong)pcVar8 & 0xffffffff,0);
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_3b0,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_358 != (char *)0x0) goto LAB_00155cdc;
    pcStack_3c8 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_3b0,"test_file_link",2,0,0);
    pcVar8 = pcStack_358;
    pcVar7 = acStack_3b0;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_358 < 0) goto LAB_00155ce6;
    pcStack_3c8 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_3b0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_3c8 = (code *)0x155ac6;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c0 = 0;
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x155af8;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_3b0,(ulong)pcVar8 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_358 < 0) goto LAB_00155cf0;
    pcVar10 = buf;
    pcStack_3c8 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_3c8 = (code *)0x155b2e;
    close((int)pcVar8);
    pcStack_3c8 = (code *)0x155b54;
    pcVar10 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_3b0,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_3c8 = (code *)0x155b6a;
    pcVar10 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_3b0,"test_file_link2",2,0,0);
    pcVar7 = pcStack_358;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_358 < 0) goto LAB_00155d09;
    pcStack_3c8 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_3b0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_3c8 = (code *)0x155bda;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c0 = 0;
    pcVar10 = (char *)0x0;
    pcStack_3c8 = (code *)0x155c0c;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_3b0,(ulong)pcVar7 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_358 < 0) goto LAB_00155d13;
    pcVar10 = buf;
    pcStack_3c8 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_3c8 = (code *)0x155c50;
    uv_fs_close(loop,acStack_3b0,(ulong)pcVar7 & 0xffffffff,0);
    pcStack_3c8 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_3c8 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_3c8 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_3c8 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_3c8 = (code *)0x155c87;
    pcVar7 = (char *)uv_default_loop();
    pcStack_3c8 = (code *)0x155c9b;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_3c8 = (code *)0x155ca5;
    uv_run(pcVar7,0);
    pcStack_3c8 = (code *)0x155caa;
    pcVar10 = (char *)uv_default_loop();
    pcStack_3c8 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_3c8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar10)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar10)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_3d0 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_3d0 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_3d0 = (code *)pcVar7;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_588,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_528 != 0) goto LAB_00155e45;
    if (lStack_530 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_588);
    iVar1 = uv_fs_readlink(0,auStack_588,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_528 != 0) goto LAB_00155e54;
    if (lStack_530 == -2) {
      uv_fs_req_cleanup(auStack_588);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_chown) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* sync chown */
  r = uv_fs_chown(NULL, &req, "test_file", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync fchown */
  r = uv_fs_fchown(NULL, &req, file, -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async chown */
  r = uv_fs_chown(loop, &req, "test_file", -1, -1, chown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);

#ifndef __MVS__
  /* chown to root (fail) */
  chown_cb_count = 0;
  r = uv_fs_chown(loop, &req, "test_file", 0, 0, chown_root_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);
#endif

  /* async fchown */
  r = uv_fs_fchown(loop, &req, file, -1, -1, fchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchown_cb_count == 1);

#ifndef __HAIKU__
  /* Haiku doesn't support hardlink */
  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync lchown */
  r = uv_fs_lchown(NULL, &req, "test_file_link", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async lchown */
  r = uv_fs_lchown(loop, &req, "test_file_link", -1, -1, lchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(lchown_cb_count == 1);
#endif

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");

  MAKE_VALGRIND_HAPPY();
  return 0;
}